

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O2

void affect_check_area(AREA_DATA_conflict *area,int where,long *vector)

{
  bool bVar1;
  AREA_AFFECT_DATA *pAVar2;
  
  if (vector != (long *)0x0) {
    pAVar2 = (AREA_AFFECT_DATA *)&area->affected;
    do {
      pAVar2 = pAVar2->next;
      if (pAVar2 == (AREA_AFFECT_DATA *)0x0) {
        return;
      }
    } while ((pAVar2->where != where) || (bVar1 = vector_equal(pAVar2->bitvector,vector), !bVar1));
    if (where == 0) {
      BITWISE_OR(area->affected_by,vector);
      return;
    }
  }
  return;
}

Assistant:

void affect_check_area(AREA_DATA *area, int where, long vector[])
{
	AREA_AFFECT_DATA *paf;

	if (vector == 0)
		return;

	for (paf = area->affected; paf != nullptr; paf = paf->next)
	{
		if (paf->where == where && vector_equal(paf->bitvector, vector))
		{
			switch (where)
			{
				case TO_AREA_AFFECTS:
					BITWISE_OR(area->affected_by, vector);
					break;
			}

			return;
		}
	}
}